

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tria_o2.cc
# Opt level: O0

unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> __thiscall
lf::geometry::TriaO2::SubGeometry(TriaO2 *this,dim_t codim,dim_t i)

{
  CommaInitializer<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *pCVar1;
  runtime_error *this_00;
  uint in_ECX;
  undefined4 in_register_00000034;
  long *plVar2;
  string local_aa8;
  allocator<char> local_a81;
  string local_a80;
  allocator<char> local_a59;
  string local_a58;
  stringstream local_a38 [8];
  stringstream ss_3;
  ostream local_a28 [376];
  ConstColXpr local_8b0;
  undefined1 local_878 [16];
  string local_868;
  allocator<char> local_841;
  string local_840;
  allocator<char> local_819;
  string local_818;
  string local_7f8;
  allocator<char> local_7d1;
  string local_7d0;
  allocator<char> local_7a9;
  string local_7a8;
  stringstream local_788 [8];
  stringstream ss_2;
  ostream local_778 [376];
  ConstColXpr local_600;
  ConstColXpr local_5c8;
  ConstColXpr local_590;
  int local_558;
  uint local_554;
  Matrix<double,__1,_3,_0,__1,_3> local_550;
  CommaInitializer<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> local_540;
  undefined1 local_520 [16];
  string local_510;
  allocator<char> local_4e9;
  string local_4e8;
  allocator<char> local_4c1;
  string local_4c0;
  string local_4a0;
  allocator<char> local_479;
  string local_478;
  allocator<char> local_451;
  string local_450;
  stringstream local_430 [8];
  stringstream ss_1;
  ostream local_420 [376];
  undefined1 local_2a8 [16];
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  uint local_20;
  dim_t local_1c;
  dim_t i_local;
  dim_t codim_local;
  TriaO2 *this_local;
  
  plVar2 = (long *)CONCAT44(in_register_00000034,codim);
  local_1c = i;
  _i_local = plVar2;
  this_local = this;
  if (i == 0) {
    if (in_ECX != 0) {
      std::__cxx11::stringstream::stringstream(local_1a8);
      std::operator<<(local_198,"i is out of bounds");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"i == 0",&local_1d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_200,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o2.cc"
                 ,&local_201);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_1d8,&local_200,0x98,&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_200);
      std::allocator<char>::~allocator(&local_201);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::allocator<char>::~allocator(&local_1d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"false",&local_249);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_270,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o2.cc"
                 ,&local_271);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_298,"",(allocator<char> *)(local_2a8 + 0xf));
      lf::base::AssertionFailed(&local_248,&local_270,0x98,&local_298);
      std::__cxx11::string::~string((string *)&local_298);
      std::allocator<char>::~allocator((allocator<char> *)(local_2a8 + 0xf));
      std::__cxx11::string::~string((string *)&local_270);
      std::allocator<char>::~allocator(&local_271);
      std::__cxx11::string::~string((string *)&local_248);
      std::allocator<char>::~allocator(&local_249);
      abort();
    }
    std::make_unique<lf::geometry::TriaO2,Eigen::Matrix<double,_1,6,0,_1,6>const&>
              ((Matrix<double,__1,_6,_0,__1,_6> *)local_2a8);
    std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
    unique_ptr<lf::geometry::TriaO2,std::default_delete<lf::geometry::TriaO2>,void>
              ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *)
               this,(unique_ptr<lf::geometry::TriaO2,_std::default_delete<lf::geometry::TriaO2>_> *)
                    local_2a8);
    std::unique_ptr<lf::geometry::TriaO2,_std::default_delete<lf::geometry::TriaO2>_>::~unique_ptr
              ((unique_ptr<lf::geometry::TriaO2,_std::default_delete<lf::geometry::TriaO2>_> *)
               local_2a8);
  }
  else if (i == 1) {
    if (2 < in_ECX) {
      std::__cxx11::stringstream::stringstream(local_430);
      std::operator<<(local_420,"i is out of bounds");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_450,"0 <= i && i <= 2",&local_451);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_478,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o2.cc"
                 ,&local_479);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_450,&local_478,0x9c,&local_4a0);
      std::__cxx11::string::~string((string *)&local_4a0);
      std::__cxx11::string::~string((string *)&local_478);
      std::allocator<char>::~allocator(&local_479);
      std::__cxx11::string::~string((string *)&local_450);
      std::allocator<char>::~allocator(&local_451);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c0,"false",&local_4c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o2.cc"
                 ,&local_4e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_510,"",(allocator<char> *)(local_520 + 0xf));
      lf::base::AssertionFailed(&local_4c0,&local_4e8,0x9c,&local_510);
      std::__cxx11::string::~string((string *)&local_510);
      std::allocator<char>::~allocator((allocator<char> *)(local_520 + 0xf));
      std::__cxx11::string::~string((string *)&local_4e8);
      std::allocator<char>::~allocator(&local_4e9);
      std::__cxx11::string::~string((string *)&local_4c0);
      std::allocator<char>::~allocator(&local_4c1);
      abort();
    }
    local_20 = in_ECX;
    local_554 = (**(code **)(*plVar2 + 8))();
    local_558 = 3;
    Eigen::Matrix<double,-1,3,0,-1,3>::Matrix<unsigned_int,int>
              ((Matrix<double,_1,3,0,_1,3> *)&local_550,&local_554,&local_558);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_6,_0,_-1,_6>_>::col
              (&local_590,(DenseBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_> *)(plVar2 + 1),
               (ulong)local_20);
    Eigen::DenseBase<Eigen::Matrix<double,-1,3,0,-1,3>>::operator<<
              (&local_540,(DenseBase<Eigen::Matrix<double,_1,3,0,_1,3>> *)&local_550,
               (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_6,_0,__1,_6>,__1,_1,_true>_>
                *)&local_590);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_6,_0,_-1,_6>_>::col
              (&local_5c8,(DenseBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_> *)(plVar2 + 1),
               (ulong)(local_20 + 1 + ((local_20 + 1) / 3) * -3));
    pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,-1,3,0,-1,3>>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,_1,3,0,_1,3>> *)&local_540,
                        (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_6,_0,__1,_6>,__1,_1,_true>_>
                         *)&local_5c8);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_6,_0,_-1,_6>_>::col
              (&local_600,(DenseBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_> *)(plVar2 + 1),
               (ulong)(local_20 + 3));
    pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,-1,3,0,-1,3>>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,_1,3,0,_1,3>> *)pCVar1,
                        (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_6,_0,__1,_6>,__1,_1,_true>_>
                         *)&local_600);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::finished(pCVar1);
    std::make_unique<lf::geometry::SegmentO2,Eigen::Matrix<double,_1,3,0,_1,3>&>
              ((Matrix<double,__1,_3,_0,__1,_3> *)local_520);
    std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
    unique_ptr<lf::geometry::SegmentO2,std::default_delete<lf::geometry::SegmentO2>,void>
              ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *)
               this,(unique_ptr<lf::geometry::SegmentO2,_std::default_delete<lf::geometry::SegmentO2>_>
                     *)local_520);
    std::unique_ptr<lf::geometry::SegmentO2,_std::default_delete<lf::geometry::SegmentO2>_>::
    ~unique_ptr((unique_ptr<lf::geometry::SegmentO2,_std::default_delete<lf::geometry::SegmentO2>_>
                 *)local_520);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::~CommaInitializer(&local_540);
    Eigen::Matrix<double,_-1,_3,_0,_-1,_3>::~Matrix(&local_550);
  }
  else {
    if (i != 2) {
      std::__cxx11::stringstream::stringstream(local_a38);
      std::operator<<(local_a28,"codim is out of bounds");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a58,"false",&local_a59);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a80,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o2.cc"
                 ,&local_a81);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_a58,&local_a80,0xa8,&local_aa8);
      std::__cxx11::string::~string((string *)&local_aa8);
      std::__cxx11::string::~string((string *)&local_a80);
      std::allocator<char>::~allocator(&local_a81);
      std::__cxx11::string::~string((string *)&local_a58);
      std::allocator<char>::~allocator(&local_a59);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"this code should not be reached");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (5 < in_ECX) {
      std::__cxx11::stringstream::stringstream(local_788);
      std::operator<<(local_778,"i is out of bounds");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7a8,"0 <= i && i <= 5",&local_7a9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o2.cc"
                 ,&local_7d1);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_7a8,&local_7d0,0xa4,&local_7f8);
      std::__cxx11::string::~string((string *)&local_7f8);
      std::__cxx11::string::~string((string *)&local_7d0);
      std::allocator<char>::~allocator(&local_7d1);
      std::__cxx11::string::~string((string *)&local_7a8);
      std::allocator<char>::~allocator(&local_7a9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_818,"false",&local_819);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_840,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o2.cc"
                 ,&local_841);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_868,"",(allocator<char> *)(local_878 + 0xf));
      lf::base::AssertionFailed(&local_818,&local_840,0xa4,&local_868);
      std::__cxx11::string::~string((string *)&local_868);
      std::allocator<char>::~allocator((allocator<char> *)(local_878 + 0xf));
      std::__cxx11::string::~string((string *)&local_840);
      std::allocator<char>::~allocator(&local_841);
      std::__cxx11::string::~string((string *)&local_818);
      std::allocator<char>::~allocator(&local_819);
      abort();
    }
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_6,_0,_-1,_6>_>::col
              (&local_8b0,(DenseBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_> *)(plVar2 + 1),
               (ulong)in_ECX);
    std::
    make_unique<lf::geometry::Point,Eigen::Block<Eigen::Matrix<double,_1,6,0,_1,6>const,_1,1,true>const>
              ((Block<const_Eigen::Matrix<double,__1,_6,_0,__1,_6>,__1,_1,_true> *)local_878);
    std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
    unique_ptr<lf::geometry::Point,std::default_delete<lf::geometry::Point>,void>
              ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *)
               this,(unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)
                    local_878);
    std::unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_>::~unique_ptr
              ((unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)
               local_878);
  }
  return (__uniq_ptr_data<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>,_true,_true>
          )(__uniq_ptr_data<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Geometry> TriaO2::SubGeometry(dim_t codim, dim_t i) const {
  switch (codim) {
    case 0: {
      LF_ASSERT_MSG(i == 0, "i is out of bounds");
      return std::make_unique<TriaO2>(coords_);
    }
    case 1: {
      LF_ASSERT_MSG(0 <= i && i <= 2, "i is out of bounds");
      return std::make_unique<SegmentO2>(
          (Eigen::Matrix<double, Eigen::Dynamic, 3>(DimGlobal(), 3)
               << coords_.col(i),
           coords_.col((i + 1) % 3), coords_.col(i + 3))
              .finished());
    }
    case 2: {
      LF_ASSERT_MSG(0 <= i && i <= 5, "i is out of bounds");
      return std::make_unique<Point>(coords_.col(i));
    }
    default: {
      LF_VERIFY_MSG(false, "codim is out of bounds")
    }
  }
}